

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O1

bool __thiscall MipsParser::parseVpfxdParameter(MipsParser *this,Parser *parser,int *result)

{
  bool bVar1;
  Token *pTVar2;
  byte bVar3;
  uint uVar4;
  bool bVar5;
  TokenSequence tokens;
  TokenSequence tokens_00;
  TokenSequence tokens_01;
  TokenSequence tokens_02;
  TokenSequence tokens_03;
  TokenSequence tokens_04;
  TokenSequence tokens_05;
  TokenSequence tokens_06;
  TokenValueSequence values;
  TokenValueSequence values_00;
  TokenValueSequence values_01;
  TokenValueSequence values_02;
  TokenValueSequence values_03;
  TokenValueSequence values_04;
  TokenValueSequence values_05;
  TokenValueSequence values_06;
  int num;
  TokenType local_68 [4];
  TokenSequenceValue local_58;
  undefined4 local_48;
  char *local_40;
  uint *local_38;
  
  local_38 = (uint *)result;
  if (parseVpfxdParameter(Parser&,int&)::sequenceParser == '\0') {
    parseVpfxdParameter();
  }
  if (parseVpfxdParameter::sequenceParser.entries.
      super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      parseVpfxdParameter::sequenceParser.entries.
      super__Vector_base<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_68[0] = Integer;
    local_68[1] = Minus;
    local_68[2] = 2;
    local_58.type = Integer;
    local_58.field_1.textValue = (char *)0x0;
    local_48 = 2;
    local_40 = (char *)0x1;
    tokens._M_len = 3;
    tokens._M_array = local_68;
    values._M_len = 2;
    values._M_array = &local_58;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,1,tokens,values);
    local_68[0] = Integer;
    local_68[1] = Minus;
    local_68[2] = 0x27;
    local_58.type = Integer;
    local_58.field_1.textValue = (char *)0x0;
    local_48 = 1;
    local_40 = "1m";
    tokens_00._M_len = 3;
    tokens_00._M_array = local_68;
    values_00._M_len = 2;
    values_00._M_array = &local_58;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,-1,tokens_00,values_00);
    local_68[0] = Integer;
    local_68[1] = Colon;
    local_68[2] = 2;
    local_58.type = Integer;
    local_58.field_1.textValue = (char *)0x0;
    local_48 = 2;
    local_40 = (char *)0x1;
    tokens_01._M_len = 3;
    tokens_01._M_array = local_68;
    values_01._M_len = 2;
    values_01._M_array = &local_58;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,1,tokens_01,values_01);
    local_68[0] = Integer;
    local_68[1] = Colon;
    local_68[2] = 0x27;
    local_58.type = Integer;
    local_58.field_1.textValue = (char *)0x0;
    local_48 = 1;
    local_40 = "1m";
    tokens_02._M_len = 3;
    tokens_02._M_array = local_68;
    values_02._M_len = 2;
    values_02._M_array = &local_58;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,-1,tokens_02,values_02);
    local_68[0] = Minus;
    local_68[1] = Integer;
    local_68[2] = Minus;
    local_68[3] = Integer;
    local_58.type = Integer;
    local_58.field_1.intValue = 1;
    local_48 = 2;
    local_40 = (char *)0x1;
    tokens_03._M_len = 4;
    tokens_03._M_array = local_68;
    values_03._M_len = 2;
    values_03._M_array = &local_58;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,3,tokens_03,values_03);
    local_68[0] = Minus;
    local_68[1] = Integer;
    local_68[2] = Minus;
    local_68[3] = NumberString;
    local_58.type = Integer;
    local_58.field_1.intValue = 1;
    local_48 = 1;
    local_40 = "1m";
    tokens_04._M_len = 4;
    tokens_04._M_array = local_68;
    values_04._M_len = 2;
    values_04._M_array = &local_58;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,-3,tokens_04,values_04);
    local_68[0] = Minus;
    local_68[1] = Integer;
    local_68[2] = Colon;
    local_68[3] = Integer;
    local_58.type = Integer;
    local_58.field_1.intValue = 1;
    local_48 = 2;
    local_40 = (char *)0x1;
    tokens_05._M_len = 4;
    tokens_05._M_array = local_68;
    values_05._M_len = 2;
    values_05._M_array = &local_58;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,3,tokens_05,values_05);
    local_68[0] = Minus;
    local_68[1] = Integer;
    local_68[2] = Colon;
    local_68[3] = NumberString;
    local_58.type = Integer;
    local_58.field_1.intValue = 1;
    local_48 = 1;
    local_40 = "1m";
    tokens_06._M_len = 4;
    tokens_06._M_array = local_68;
    values_06._M_len = 2;
    values_06._M_array = &local_58;
    TokenSequenceParser::addEntry(&parseVpfxdParameter::sequenceParser,-3,tokens_06,values_06);
  }
  bVar3 = 0;
  bVar5 = false;
  uVar4 = 0;
  do {
    if ((uVar4 != 0) &&
       (pTVar2 = Tokenizer::nextToken
                           ((parser->entries).
                            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer),
       pTVar2->type != Comma)) {
LAB_00169354:
      if (!bVar5) {
        return false;
      }
      break;
    }
    Tokenizer::eatTokens
              ((parser->entries).
               super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].tokenizer,1);
    local_58.type = Invalid;
    bVar1 = TokenSequenceParser::parse(&parseVpfxdParameter::sequenceParser,parser,(int *)&local_58)
    ;
    if (!bVar1) goto LAB_00169354;
    if ((int)local_58.type < 0) {
      *local_38 = *local_38 | 0x100 << ((byte)uVar4 & 0x1f);
      local_58.type = -local_58.type;
    }
    *local_38 = *local_38 | local_58.type << (bVar3 & 0x1f);
    if (!bVar1) goto LAB_00169354;
    bVar5 = 2 < uVar4;
    uVar4 = uVar4 + 1;
    bVar3 = bVar3 + 2;
  } while (uVar4 != 4);
  pTVar2 = Tokenizer::nextToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
  return pTVar2->type == RBrack;
}

Assistant:

bool MipsParser::parseVpfxdParameter(Parser& parser, int& result)
{
	static TokenSequenceParser sequenceParser;

	// initialize on first use
	if (sequenceParser.getEntryCount() == 0)
	{
		// 0-1
		sequenceParser.addEntry(1,
			{TokenType::Integer, TokenType::Minus, TokenType::Integer},
			{INT64_C(0), INT64_C(1)} );
		// 0-1
		sequenceParser.addEntry(-1,
			{TokenType::Integer, TokenType::Minus, TokenType::NumberString},
			{INT64_C(0), "1m"} );
		// 0:1
		sequenceParser.addEntry(1,
			{TokenType::Integer, TokenType::Colon, TokenType::Integer},
			{INT64_C(0), INT64_C(1)} );
		// 0:1
		sequenceParser.addEntry(-1,
			{TokenType::Integer, TokenType::Colon, TokenType::NumberString},
			{INT64_C(0), "1m"} );
		// -1-1
		sequenceParser.addEntry(3,
			{TokenType::Minus, TokenType::Integer, TokenType::Minus, TokenType::Integer},
			{INT64_C(1), INT64_C(1)} );
		// -1-1m
		sequenceParser.addEntry(-3,
			{TokenType::Minus, TokenType::Integer, TokenType::Minus, TokenType::NumberString},
			{INT64_C(1), "1m"} );
		// -1:1
		sequenceParser.addEntry(3,
			{TokenType::Minus, TokenType::Integer, TokenType::Colon, TokenType::Integer},
			{INT64_C(1), INT64_C(1)} );
		// -1:1m
		sequenceParser.addEntry(-3,
			{TokenType::Minus, TokenType::Integer, TokenType::Colon, TokenType::NumberString},
			{INT64_C(1), "1m"} );
	}

	for (int i = 0; i < 4; i++)
	{
		if (i != 0)
		{
			if (parser.nextToken().type != TokenType::Comma)
				return false;
		}

		parser.eatToken();
		
		int num = 0;
		if (!sequenceParser.parse(parser,num))
			return false;

		// m versions
		if (num < 0)
		{
			result |= 1 << (8+i);
			num = abs(num);
		}

		result |= num << (2*i);
	}
	
	return parser.nextToken().type == TokenType::RBrack;
}